

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliStoreMetaBlockFast
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               int is_last,BrotliEncoderParams *params,Command *commands,size_t n_commands,
               size_t *storage_ix,uint8_t *storage)

{
  uint32_t uVar1;
  uint uVar2;
  size_t sVar3;
  uint16_t *lit_bits_00;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  uint8_t *lit_depth_00;
  size_t histogram_total;
  uint8_t *cmd_depth_00;
  uint16_t *cmd_bits;
  uint8_t *dist_depth_00;
  uint16_t *bits;
  uint8_t dist_depth [140];
  uint8_t lit_depth_1 [256];
  uint16_t lit_bits_1 [256];
  uint16_t dist_bits [140];
  uint8_t lit_depth [256];
  uint8_t cmd_depth [704];
  uint32_t histogram [256];
  size_t local_ce8;
  HistogramLiteral local_cd8;
  uint16_t lit_bits [256];
  size_t local_48;
  
  uVar1 = (params->dist).alphabet_size;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  uVar6 = *storage_ix;
  uVar4 = uVar6 >> 3;
  *(ulong *)(storage + uVar4) = (ulong)storage[uVar4];
  *storage_ix = uVar6 + 0xd;
  if (n_commands < 0x81) {
    histogram_total = 0;
    memset(histogram,0,0x400);
    sVar3 = start_pos;
    for (sVar5 = 0; sVar5 != n_commands; sVar5 = sVar5 + 1) {
      uVar2 = commands[sVar5].insert_len_;
      uVar7 = commands[sVar5].copy_len_;
      sVar9 = sVar3;
      for (lVar8 = 0; -lVar8 != (ulong)uVar2; lVar8 = lVar8 + -1) {
        histogram[input[sVar9 & mask]] = histogram[input[sVar9 & mask]] + 1;
        sVar9 = sVar9 + 1;
      }
      histogram_total = histogram_total + uVar2;
      sVar3 = (sVar3 + (uVar7 & 0x1ffffff)) - lVar8;
    }
    BrotliBuildAndStoreHuffmanTreeFast
              (m,histogram,histogram_total,8,lit_depth,lit_bits,storage_ix,storage);
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) =
         0x92624416307003 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
    *storage_ix = uVar4 + 0x38;
    uVar6 = uVar4 + 0x38 >> 3;
    *(ulong *)(storage + uVar6) = (ulong)storage[uVar6];
    uVar6 = uVar4 + 0x3b;
    *storage_ix = uVar6;
    *(ulong *)(storage + (uVar6 >> 3)) =
         0x369dc03L << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar4 + 0x57;
    lit_depth_00 = lit_depth;
    bits = kStaticDistanceCodeBits;
    dist_depth_00 =
         "\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06\x06"
    ;
    cmd_bits = kStaticCommandCodeBits;
    cmd_depth_00 = 
    "\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v"
    ;
    lit_bits_00 = lit_bits;
  }
  else {
    uVar7 = uVar1 - 1;
    uVar2 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    memset(&local_cd8,0,0x408);
    local_cd8.bit_cost_ = INFINITY;
    memset(histogram,0,0xb08);
    memset((HistogramDistance *)lit_bits,0,0x888);
    BuildHistograms(input,start_pos,mask,commands,n_commands,&local_cd8,
                    (HistogramCommand *)histogram,(HistogramDistance *)lit_bits);
    BrotliBuildAndStoreHuffmanTreeFast
              (m,local_cd8.data_,local_cd8.total_count_,8,lit_depth_1,lit_bits_1,storage_ix,storage)
    ;
    BrotliBuildAndStoreHuffmanTreeFast
              (m,histogram,local_ce8,10,cmd_depth,(uint16_t *)lit_depth,storage_ix,storage);
    bits = dist_bits;
    BrotliBuildAndStoreHuffmanTreeFast
              (m,(uint32_t *)lit_bits,local_48,(ulong)((uVar2 ^ 0xffffffe0) + 0x21),dist_depth,bits,
               storage_ix,storage);
    lit_depth_00 = lit_depth_1;
    dist_depth_00 = dist_depth;
    cmd_bits = (uint16_t *)lit_depth;
    cmd_depth_00 = cmd_depth;
    lit_bits_00 = lit_bits_1;
  }
  StoreDataWithHuffmanCodes
            (input,start_pos,mask,commands,n_commands,lit_depth_00,lit_bits_00,cmd_depth_00,cmd_bits
             ,dist_depth_00,bits,storage_ix,storage);
  if (is_last != 0) {
    uVar2 = (int)*storage_ix + 7;
    *storage_ix = (ulong)(uVar2 & 0xfffffff8);
    storage[uVar2 >> 3] = '\0';
  }
  return;
}

Assistant:

void BrotliStoreMetaBlockFast(MemoryManager* m,
    const uint8_t* input, size_t start_pos, size_t length, size_t mask,
    BROTLI_BOOL is_last, const BrotliEncoderParams* params,
    const Command* commands, size_t n_commands,
    size_t* storage_ix, uint8_t* storage) {
  uint32_t num_distance_symbols = params->dist.alphabet_size;
  uint32_t distance_alphabet_bits =
      Log2FloorNonZero(num_distance_symbols - 1) + 1;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  BrotliWriteBits(13, 0, storage_ix, storage);

  if (n_commands <= 128) {
    uint32_t histogram[BROTLI_NUM_LITERAL_SYMBOLS] = { 0 };
    size_t pos = start_pos;
    size_t num_literals = 0;
    size_t i;
    uint8_t lit_depth[BROTLI_NUM_LITERAL_SYMBOLS];
    uint16_t lit_bits[BROTLI_NUM_LITERAL_SYMBOLS];
    for (i = 0; i < n_commands; ++i) {
      const Command cmd = commands[i];
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        ++histogram[input[pos & mask]];
        ++pos;
      }
      num_literals += cmd.insert_len_;
      pos += CommandCopyLen(&cmd);
    }
    BrotliBuildAndStoreHuffmanTreeFast(m, histogram, num_literals,
                                       /* max_bits = */ 8,
                                       lit_depth, lit_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    StoreStaticCommandHuffmanTree(storage_ix, storage);
    StoreStaticDistanceHuffmanTree(storage_ix, storage);
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, lit_depth, lit_bits,
                              kStaticCommandCodeDepth,
                              kStaticCommandCodeBits,
                              kStaticDistanceCodeDepth,
                              kStaticDistanceCodeBits,
                              storage_ix, storage);
  } else {
    HistogramLiteral lit_histo;
    HistogramCommand cmd_histo;
    HistogramDistance dist_histo;
    uint8_t lit_depth[BROTLI_NUM_LITERAL_SYMBOLS];
    uint16_t lit_bits[BROTLI_NUM_LITERAL_SYMBOLS];
    uint8_t cmd_depth[BROTLI_NUM_COMMAND_SYMBOLS];
    uint16_t cmd_bits[BROTLI_NUM_COMMAND_SYMBOLS];
    uint8_t dist_depth[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
    uint16_t dist_bits[MAX_SIMPLE_DISTANCE_ALPHABET_SIZE];
    HistogramClearLiteral(&lit_histo);
    HistogramClearCommand(&cmd_histo);
    HistogramClearDistance(&dist_histo);
    BuildHistograms(input, start_pos, mask, commands, n_commands,
                    &lit_histo, &cmd_histo, &dist_histo);
    BrotliBuildAndStoreHuffmanTreeFast(m, lit_histo.data_,
                                       lit_histo.total_count_,
                                       /* max_bits = */ 8,
                                       lit_depth, lit_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    BrotliBuildAndStoreHuffmanTreeFast(m, cmd_histo.data_,
                                       cmd_histo.total_count_,
                                       /* max_bits = */ 10,
                                       cmd_depth, cmd_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    BrotliBuildAndStoreHuffmanTreeFast(m, dist_histo.data_,
                                       dist_histo.total_count_,
                                       /* max_bits = */
                                       distance_alphabet_bits,
                                       dist_depth, dist_bits,
                                       storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
    StoreDataWithHuffmanCodes(input, start_pos, mask, commands,
                              n_commands, lit_depth, lit_bits,
                              cmd_depth, cmd_bits,
                              dist_depth, dist_bits,
                              storage_ix, storage);
  }

  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}